

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O1

int kvtree_open_with_lock(char *file,int flags,mode_t mode,int write)

{
  uint __errnum;
  int fd;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  undefined4 in_register_00000014;
  
  fd = kvtree_open(file,flags,CONCAT44(in_register_00000014,mode));
  if (fd < 0) {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    kvtree_err("Opening file for write: kvtree_open(%s) errno=%d %s @ %s:%d",file,(ulong)__errnum,
               pcVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
               ,0xd8);
  }
  else {
    iVar1 = kvtree_file_lock_read_write(file,fd,write);
    if (iVar1 != 0) {
      close(fd);
      fd = 1;
    }
  }
  return fd;
}

Assistant:

int kvtree_open_with_lock(const char* file, int flags, mode_t mode, int write)
{
  /* open the file */
  int fd = kvtree_open(file, flags, mode);
  if (fd < 0) {
    kvtree_err("Opening file for write: kvtree_open(%s) errno=%d %s @ %s:%d",
      file, errno, strerror(errno), __FILE__, __LINE__
    );
    return fd;
  }

  /* acquire shared (write=0) or exclusive (write=1) file lock */
  int ret = kvtree_file_lock_read_write(file, fd, write);
  if (ret != KVTREE_SUCCESS) {
    close(fd);
    return ret;
  }

  /* return the opened file descriptor */
  return fd;
}